

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int Wlc_BlastGetConst(int *pNum,int nNum)

{
  uint local_24;
  int local_20;
  int Res;
  int i;
  int nNum_local;
  int *pNum_local;
  
  local_24 = 0;
  local_20 = 0;
  do {
    if (nNum <= local_20) {
      return local_24;
    }
    if (pNum[local_20] == 1) {
      local_24 = 1 << ((byte)local_20 & 0x1f) | local_24;
    }
    else if (pNum[local_20] != 0) {
      return -1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int Wlc_BlastGetConst( int * pNum, int nNum )
{
    int i, Res = 0;
    for ( i = 0; i < nNum; i++ )
        if ( pNum[i] == 1 )
            Res |= (1 << i);
        else if ( pNum[i] != 0 )
            return -1;
    return Res;
}